

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O3

void __thiscall r_exec::_Mem::inject(_Mem *this,View *view)

{
  Code *object;
  ushort uVar1;
  int iVar2;
  Group *this_00;
  _func_int **pp_Var3;
  ulong uVar4;
  ulong ijt;
  View *pVVar5;
  
  iVar2 = (*((view->super_View).object.object)->_vptr__Object[0xe])();
  if ((char)iVar2 == '\0') {
    this_00 = r_exec::View::get_host(view);
    iVar2 = (*(this_00->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[0xe])(this_00);
    if ((char)iVar2 == '\0') {
      uVar4 = (*Now)();
      uVar1 = r_code::Atom::asIndex();
      ijt = r_code::Utils::GetTimestamp
                      ((Atom *)((long)(view->super_View).references + (ulong)uVar1 * 4 + 0x18));
      object = (Code *)(view->super_View).object.object;
      if (object->storage_index < 0) {
        if (ijt <= uVar4) {
          inject_new_object(this,view);
          return;
        }
        pVVar5 = (View *)operator_new(0x28);
        InjectionJob::InjectionJob((InjectionJob *)pVVar5,view,ijt);
        view = pVVar5;
      }
      else {
        if (ijt <= uVar4) {
          r_exec::View::set_object(view,object);
          Group::inject_existing_object(this_00,view);
          return;
        }
        pVVar5 = (View *)operator_new(0x28);
        EInjectionJob::EInjectionJob((EInjectionJob *)pVVar5,view,ijt);
        view = pVVar5;
      }
      if (this->state != STOPPED) {
        JobQueue<r_exec::TimeJob>::pushJob(&this->m_timeJobQueue,(TimeJob *)view);
        return;
      }
      pp_Var3 = (view->super_View).super__Object._vptr__Object;
      goto LAB_00188823;
    }
  }
  pp_Var3 = (view->super_View).super__Object._vptr__Object;
LAB_00188823:
  (*pp_Var3[1])(view);
  return;
}

Assistant:

void _Mem::inject(View *view)
{
    if (view->object->is_invalidated()) {
        delete view;
        return;
    }

    Group *host = view->get_host();

    if (host->is_invalidated()) {
        delete view;
        return;
    }

    uint64_t now = Now();
    uint64_t ijt = view->get_ijt();

    if (view->object->is_registered()) { // existing object.
        if (ijt <= now) {
            inject_existing_object(view, view->object, host);
        } else {
            pushTimeJob(new EInjectionJob(view, ijt));
        }
    } else { // new object.
        if (ijt <= now) {
            inject_new_object(view);
        } else {
            pushTimeJob(new InjectionJob(view, ijt));
        }
    }
}